

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFerTron_dns.c
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  uint uVar2;
  UserData data;
  N_Vector u;
  N_Vector u_00;
  N_Vector u_01;
  N_Vector s;
  long *plVar3;
  void *kmem;
  char *pcVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  sunrealtype in_XMM1_Qa;
  SUNContext sunctx;
  undefined8 local_58;
  long local_50;
  long *local_48;
  long local_40;
  void *local_38;
  
  uVar2 = SUNContext_Create(0,&local_58);
  if ((int)uVar2 < 0) {
    pcVar4 = "SUNContext_Create";
  }
  else {
    data = (UserData)malloc(0x20);
    data->lb[0] = 0.25;
    data->lb[1] = 1.5;
    *(undefined4 *)data->ub = 0;
    *(undefined4 *)((long)data->ub + 4) = 0x3ff00000;
    *(undefined4 *)(data->ub + 1) = 0x4d12d84a;
    *(undefined4 *)((long)data->ub + 0xc) = 0x401921fb;
    u = (N_Vector)N_VNew_Serial(6,local_58);
    if (u == (N_Vector)0x0) {
      main_cold_8();
      return 1;
    }
    u_00 = (N_Vector)N_VNew_Serial(6,local_58);
    if (u_00 == (N_Vector)0x0) {
      main_cold_7();
      return 1;
    }
    u_01 = (N_Vector)N_VNew_Serial(6,local_58);
    if (u_01 == (N_Vector)0x0) {
      main_cold_6();
      return 1;
    }
    s = (N_Vector)N_VNew_Serial(6,local_58);
    if (s == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    plVar3 = (long *)N_VNew_Serial(6,local_58);
    if (plVar3 == (long *)0x0) {
      main_cold_4();
      return 1;
    }
    SetInitialGuess1(u,data);
    SetInitialGuess2(u_00,data);
    N_VConst(0,s);
    puVar1 = *(undefined8 **)(*plVar3 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)(puVar1 + 2) = 0;
    *(undefined4 *)((long)puVar1 + 0x14) = 0x3ff00000;
    *(undefined4 *)(puVar1 + 3) = 0;
    *(undefined4 *)((long)puVar1 + 0x1c) = 0xbff00000;
    *(undefined4 *)(puVar1 + 4) = 0;
    *(undefined4 *)((long)puVar1 + 0x24) = 0x3ff00000;
    *(undefined4 *)(puVar1 + 5) = 0;
    *(undefined4 *)((long)puVar1 + 0x2c) = 0xbff00000;
    local_48 = plVar3;
    kmem = (void *)KINCreate(local_58);
    local_38 = kmem;
    if (kmem == (void *)0x0) {
      main_cold_3();
      return 1;
    }
    uVar2 = KINSetUserData(kmem,data);
    if ((int)uVar2 < 0) {
      pcVar4 = "KINSetUserData";
    }
    else {
      uVar2 = KINSetConstraints(kmem,local_48);
      if ((int)uVar2 < 0) {
        pcVar4 = "KINSetConstraints";
      }
      else {
        uVar2 = KINSetFuncNormTol(0x88e368f1,kmem);
        if ((int)uVar2 < 0) {
          pcVar4 = "KINSetFuncNormTol";
        }
        else {
          uVar2 = KINSetScaledStepTol(0x88e368f1,kmem);
          if ((int)uVar2 < 0) {
            pcVar4 = "KINSetScaledStepTol";
          }
          else {
            uVar2 = KINInit(kmem,func,u_01);
            if ((int)uVar2 < 0) {
              pcVar4 = "KINInit";
            }
            else {
              local_50 = SUNDenseMatrix(6,6,local_58);
              if (local_50 == 0) {
                main_cold_2();
                return 1;
              }
              local_40 = SUNLinSol_Dense(u_01,local_50,local_58);
              if (local_40 == 0) {
                main_cold_1();
                return 1;
              }
              uVar2 = KINSetLinearSolver(kmem,local_40,local_50);
              if (-1 < (int)uVar2) {
                PrintHeader((sunrealtype)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),in_XMM1_Qa);
                puts("\n------------------------------------------");
                puts("\nInitial guess on lower bounds");
                printf("  [x1,x2] = ");
                puVar1 = *(undefined8 **)((long)u->content + 0x10);
                printf(" %8.6g  %8.6g\n",(int)*puVar1,puVar1[1]);
                N_VScale(0,u,u_01);
                SolveIt(kmem,u_01,s,0,1);
                N_VScale(0,u,u_01);
                SolveIt(kmem,u_01,s,1,1);
                N_VScale(0,u,u_01);
                SolveIt(kmem,u_01,s,0,0);
                N_VScale(0,u,u_01);
                SolveIt(kmem,u_01,s,1,0);
                puts("\n------------------------------------------");
                puts("\nInitial guess in middle of feasible region");
                printf("  [x1,x2] = ");
                puVar1 = *(undefined8 **)((long)u_00->content + 0x10);
                printf(" %8.6g  %8.6g\n",(int)*puVar1,puVar1[1]);
                N_VScale(0,u_00,u_01);
                SolveIt(kmem,u_01,s,0,1);
                N_VScale(0,u_00,u_01);
                SolveIt(kmem,u_01,s,1,1);
                N_VScale(0,u_00,u_01);
                SolveIt(kmem,u_01,s,0,0);
                N_VScale(0,u_00,u_01);
                SolveIt(kmem,u_01,s,1,0);
                N_VDestroy(u);
                N_VDestroy(u_00);
                N_VDestroy(u_01);
                N_VDestroy(s);
                N_VDestroy(local_48);
                KINFree(&local_38);
                SUNLinSolFree(local_40);
                SUNMatDestroy(local_50);
                free(data);
                SUNContext_Free(&local_58);
                return 0;
              }
              pcVar4 = "KINSetLinearSolver";
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar4,(ulong)uVar2);
  return 1;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  UserData data;
  sunrealtype fnormtol, scsteptol;
  N_Vector u1, u2, u, s, c;
  int glstr, mset, retval;
  void* kmem;
  SUNMatrix J;
  SUNLinearSolver LS;

  u1 = u2 = u = NULL;
  s = c = NULL;
  kmem  = NULL;
  J     = NULL;
  LS    = NULL;
  data  = NULL;

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* User data */

  data        = (UserData)malloc(sizeof *data);
  data->lb[0] = PT25;
  data->ub[0] = ONE;
  data->lb[1] = ONEPT5;
  data->ub[1] = TWO * PI;

  /* Create serial vectors of length NEQ */
  u1 = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u1, "N_VNew_Serial", 0)) { return (1); }

  u2 = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u2, "N_VNew_Serial", 0)) { return (1); }

  u = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)u, "N_VNew_Serial", 0)) { return (1); }

  s = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)s, "N_VNew_Serial", 0)) { return (1); }

  c = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)c, "N_VNew_Serial", 0)) { return (1); }

  SetInitialGuess1(u1, data);
  SetInitialGuess2(u2, data);

  N_VConst(ONE, s); /* no scaling */

  Ith(c, 1) = ZERO; /* no constraint on x1 */
  Ith(c, 2) = ZERO; /* no constraint on x2 */
  Ith(c, 3) = ONE;  /* l1 = x1 - x1_min >= 0 */
  Ith(c, 4) = -ONE; /* L1 = x1 - x1_max <= 0 */
  Ith(c, 5) = ONE;  /* l2 = x2 - x2_min >= 0 */
  Ith(c, 6) = -ONE; /* L2 = x2 - x22_min <= 0 */

  fnormtol  = FTOL;
  scsteptol = STOL;

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  retval = KINSetUserData(kmem, data);
  if (check_retval(&retval, "KINSetUserData", 1)) { return (1); }
  retval = KINSetConstraints(kmem, c);
  if (check_retval(&retval, "KINSetConstraints", 1)) { return (1); }
  retval = KINSetFuncNormTol(kmem, fnormtol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }
  retval = KINSetScaledStepTol(kmem, scsteptol);
  if (check_retval(&retval, "KINSetScaledStepTol", 1)) { return (1); }

  retval = KINInit(kmem, func, u);
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* Create dense SUNMatrix */
  J = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)J, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(u, J, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to KINSOL */
  retval = KINSetLinearSolver(kmem, LS, J);
  if (check_retval(&retval, "KINSetLinearSolver", 1)) { return (1); }

  /* Print out the problem size, solution parameters, initial guess. */
  PrintHeader(fnormtol, scsteptol);

  /* --------------------------- */

  printf("\n------------------------------------------\n");
  printf("\nInitial guess on lower bounds\n");
  printf("  [x1,x2] = ");
  PrintOutput(u1);

  N_VScale(ONE, u1, u);
  glstr = KIN_NONE;
  mset  = 1;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u1, u);
  glstr = KIN_LINESEARCH;
  mset  = 1;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u1, u);
  glstr = KIN_NONE;
  mset  = 0;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u1, u);
  glstr = KIN_LINESEARCH;
  mset  = 0;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  printf("\n------------------------------------------\n");
  printf("\nInitial guess in middle of feasible region\n");
  printf("  [x1,x2] = ");
  PrintOutput(u2);

  N_VScale(ONE, u2, u);
  glstr = KIN_NONE;
  mset  = 1;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u2, u);
  glstr = KIN_LINESEARCH;
  mset  = 1;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u2, u);
  glstr = KIN_NONE;
  mset  = 0;
  SolveIt(kmem, u, s, glstr, mset);

  /* --------------------------- */

  N_VScale(ONE, u2, u);
  glstr = KIN_LINESEARCH;
  mset  = 0;
  SolveIt(kmem, u, s, glstr, mset);

  /* Free memory */

  N_VDestroy(u1);
  N_VDestroy(u2);
  N_VDestroy(u);
  N_VDestroy(s);
  N_VDestroy(c);
  KINFree(&kmem);
  SUNLinSolFree(LS);
  SUNMatDestroy(J);
  free(data);
  SUNContext_Free(&sunctx);

  return (0);
}